

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txorphanage.cpp
# Opt level: O0

void __thiscall TxOrphanage::EraseForBlock(TxOrphanage *this,CBlock *block)

{
  string_view source_file;
  string_view logging_function;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  iterator iVar4;
  long in_FS_OFFSET;
  transaction_identifier<true> *orphanHash;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *__range2_1;
  CTransaction *orphanTx;
  int *in_stack_00000070;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range2;
  CTransaction *tx;
  CTransactionRef *ptx;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range1;
  iterator __end2_1;
  iterator __begin2_1;
  int nErased;
  iterator mi;
  iterator itByPrev;
  const_iterator __end2;
  const_iterator __begin2;
  const_iterator __end1;
  const_iterator __begin1;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> vOrphanErase;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  map<COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
  *in_stack_fffffffffffffec0;
  __shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffed8;
  LogFlags in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff2c;
  ConstevalFormatString<1U> in_stack_ffffffffffffff68;
  TxOrphanage *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  int local_64;
  _Base_ptr local_60;
  _Base_ptr local_58;
  _Base_ptr local_50;
  _Base_ptr local_48;
  CTxIn *local_40;
  CTxIn *local_38;
  shared_ptr<const_CTransaction> *local_30;
  shared_ptr<const_CTransaction> *local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::vector
            ((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *
             )CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  local_28 = (shared_ptr<const_CTransaction> *)
             std::
             vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)in_stack_fffffffffffffec0);
  local_30 = (shared_ptr<const_CTransaction> *)
             std::
             vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)in_stack_fffffffffffffec0);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                           ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)in_stack_fffffffffffffec8,
                            (__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)in_stack_fffffffffffffec0), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator*((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*(in_stack_fffffffffffffec8);
    local_38 = (CTxIn *)std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
                                  ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                                   in_stack_fffffffffffffec0);
    local_40 = (CTxIn *)std::vector<CTxIn,_std::allocator<CTxIn>_>::end
                                  ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                                   in_stack_fffffffffffffec0);
    while (bVar1 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                             ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                               *)in_stack_fffffffffffffec8,
                              (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                               *)in_stack_fffffffffffffec0), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
      operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      local_48 = (_Base_ptr)
                 std::
                 map<COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
                 ::find(in_stack_fffffffffffffec0,
                        (key_type *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      local_50 = (_Base_ptr)
                 std::
                 map<COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
                 ::end(in_stack_fffffffffffffec0);
      bVar1 = std::operator==((_Self *)in_stack_fffffffffffffec8,(_Self *)in_stack_fffffffffffffec0)
      ;
      if (!bVar1) {
        std::
        _Rb_tree_iterator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        local_58 = (_Base_ptr)
                   std::
                   set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                   ::begin((set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                            *)in_stack_fffffffffffffec0);
        while( true ) {
          std::
          _Rb_tree_iterator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>
          ::operator->((_Rb_tree_iterator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          local_60 = (_Base_ptr)
                     std::
                     set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                     ::end((set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                            *)in_stack_fffffffffffffec0);
          bVar1 = std::operator==((_Self *)in_stack_fffffffffffffec8,
                                  (_Self *)in_stack_fffffffffffffec0);
          if (((bVar1 ^ 0xffU) & 1) == 0) break;
          std::
          _Rb_tree_const_iterator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
          ::operator*((_Rb_tree_const_iterator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
                       *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          std::
          _Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>::
          operator->((_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>
                      *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*(in_stack_fffffffffffffec8);
          CTransaction::GetWitnessHash
                    ((CTransaction *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          ::push_back((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                       *)in_stack_fffffffffffffec8,(value_type *)in_stack_fffffffffffffec0);
          std::
          _Rb_tree_const_iterator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
          ::operator++((_Rb_tree_const_iterator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
                        *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        }
      }
      __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
      operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator++((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  }
  sVar3 = std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          ::size((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                  *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  if (sVar3 != 0) {
    local_64 = 0;
    std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::begin
              ((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                *)in_stack_fffffffffffffec0);
    iVar4 = std::
            vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
            end((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                 *)in_stack_fffffffffffffec0);
    while (bVar1 = __gnu_cxx::
                   operator==<transaction_identifier<true>_*,_std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                             ((__normal_iterator<transaction_identifier<true>_*,_std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                               *)in_stack_fffffffffffffec8,
                              (__normal_iterator<transaction_identifier<true>_*,_std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                               *)in_stack_fffffffffffffec0), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<transaction_identifier<true>_*,_std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
      ::operator*((__normal_iterator<transaction_identifier<true>_*,_std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      iVar2 = EraseTx(in_stack_ffffffffffffff70,(Wtxid *)in_stack_ffffffffffffff68.fmt);
      local_64 = iVar2 + local_64;
      __gnu_cxx::
      __normal_iterator<transaction_identifier<true>_*,_std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
      ::operator++((__normal_iterator<transaction_identifier<true>_*,_std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    }
    bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),Trace)
    ;
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      in_stack_fffffffffffffec8 =
           (__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           &local_64;
      logging_function._M_str = (char *)iVar4._M_current;
      logging_function._M_len = in_stack_ffffffffffffff80;
      source_file._M_str = in_stack_ffffffffffffff78;
      source_file._M_len = (size_t)in_stack_ffffffffffffff70;
      LogPrintFormatInternal<int>
                (logging_function,source_file,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20,
                 (Level)orphanTx,in_stack_ffffffffffffff68,in_stack_00000070);
    }
  }
  std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::~vector
            ((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *
             )in_stack_fffffffffffffec8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TxOrphanage::EraseForBlock(const CBlock& block)
{
    std::vector<Wtxid> vOrphanErase;

    for (const CTransactionRef& ptx : block.vtx) {
        const CTransaction& tx = *ptx;

        // Which orphan pool entries must we evict?
        for (const auto& txin : tx.vin) {
            auto itByPrev = m_outpoint_to_orphan_it.find(txin.prevout);
            if (itByPrev == m_outpoint_to_orphan_it.end()) continue;
            for (auto mi = itByPrev->second.begin(); mi != itByPrev->second.end(); ++mi) {
                const CTransaction& orphanTx = *(*mi)->second.tx;
                vOrphanErase.push_back(orphanTx.GetWitnessHash());
            }
        }
    }

    // Erase orphan transactions included or precluded by this block
    if (vOrphanErase.size()) {
        int nErased = 0;
        for (const auto& orphanHash : vOrphanErase) {
            nErased += EraseTx(orphanHash);
        }
        LogDebug(BCLog::TXPACKAGES, "Erased %d orphan transaction(s) included or conflicted by block\n", nErased);
    }
}